

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O2

void __thiscall Box::Box(Box *this,Vector *l,Vector *s1,Vector *s2,Vector *s3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_0010abc8
  ;
  dVar1 = l->z;
  (this->loc).z = dVar1;
  dVar2 = s1->z;
  (this->e1).z = dVar2;
  dVar3 = s2->z;
  (this->e2).z = dVar3;
  dVar4 = s3->z;
  (this->e3).z = dVar4;
  dVar5 = l->x;
  dVar6 = l->y;
  (this->loc).x = dVar5;
  (this->loc).y = dVar6;
  dVar7 = s1->x;
  dVar8 = s1->y;
  (this->e1).x = dVar7;
  (this->e1).y = dVar8;
  dVar9 = s2->x;
  dVar10 = s2->y;
  (this->e2).x = dVar9;
  (this->e2).y = dVar10;
  dVar11 = s3->x;
  dVar12 = s3->y;
  (this->e3).x = dVar11;
  (this->e3).y = dVar12;
  (this->center).x = (dVar7 + dVar9 + dVar11) * 0.5 + dVar5;
  (this->center).y = (dVar8 + dVar10 + dVar12) * 0.5 + dVar6;
  (this->center).z = (dVar2 + dVar3 + dVar4) * 0.5 + dVar1;
  init_normals(this);
  return;
}

Assistant:

Box(Vector const& l, Vector const& s1, Vector const& s2, Vector const& s3)
        : loc( l )
        , e1( s1 )
        , e2( s2 )
        , e3( s3 )
    {
        center = loc + (e1 + e2 + e3) * 0.5;
        init_normals();
    }